

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.c
# Opt level: O0

void av1_build_interintra_predictor
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t *pred,int stride,BUFFER_SET *ctx,int plane,
               BLOCK_SIZE bsize)

{
  int iVar1;
  MACROBLOCKD *in_RSI;
  uint8_t intrapredictor_1 [16384];
  uint16_t intrapredictor [16384];
  uint8_t *in_stack_ffffffffffff4000;
  int in_stack_ffffffffffff400c;
  uint8_t *in_stack_ffffffffffff4010;
  int in_stack_ffffffffffff4018;
  BLOCK_SIZE in_stack_ffffffffffff401f;
  MACROBLOCKD *in_stack_ffffffffffff4020;
  uint8_t *in_stack_ffffffffffff4030;
  BUFFER_SET *in_stack_ffffffffffff4038;
  int in_stack_ffffffffffff4040;
  BLOCK_SIZE in_stack_ffffffffffff4047;
  MACROBLOCKD *in_stack_ffffffffffff4048;
  int in_stack_ffffffffffff4050;
  undefined4 in_stack_ffffffffffff4054;
  int in_stack_ffffffffffff4080;
  
  iVar1 = is_cur_buf_hbd(in_RSI);
  if (iVar1 == 0) {
    av1_build_intra_predictors_for_interintra
              ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffff4054,in_stack_ffffffffffff4050),
               in_stack_ffffffffffff4048,in_stack_ffffffffffff4047,in_stack_ffffffffffff4040,
               in_stack_ffffffffffff4038,in_stack_ffffffffffff4030,in_stack_ffffffffffff4080);
    av1_combine_interintra
              (in_stack_ffffffffffff4020,in_stack_ffffffffffff401f,in_stack_ffffffffffff4018,
               in_stack_ffffffffffff4010,in_stack_ffffffffffff400c,in_stack_ffffffffffff4000,
               in_stack_ffffffffffff4050);
  }
  else {
    av1_build_intra_predictors_for_interintra
              ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffff4054,in_stack_ffffffffffff4050),
               in_stack_ffffffffffff4048,in_stack_ffffffffffff4047,in_stack_ffffffffffff4040,
               in_stack_ffffffffffff4038,in_stack_ffffffffffff4030,in_stack_ffffffffffff4080);
    av1_combine_interintra
              (in_stack_ffffffffffff4020,in_stack_ffffffffffff401f,in_stack_ffffffffffff4018,
               in_stack_ffffffffffff4010,in_stack_ffffffffffff400c,in_stack_ffffffffffff4000,
               in_stack_ffffffffffff4050);
  }
  return;
}

Assistant:

void av1_build_interintra_predictor(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                    uint8_t *pred, int stride,
                                    const BUFFER_SET *ctx, int plane,
                                    BLOCK_SIZE bsize) {
  assert(bsize < BLOCK_SIZES_ALL);
  if (is_cur_buf_hbd(xd)) {
    DECLARE_ALIGNED(16, uint16_t, intrapredictor[MAX_SB_SQUARE]);
    av1_build_intra_predictors_for_interintra(
        cm, xd, bsize, plane, ctx, CONVERT_TO_BYTEPTR(intrapredictor),
        MAX_SB_SIZE);
    av1_combine_interintra(xd, bsize, plane, pred, stride,
                           CONVERT_TO_BYTEPTR(intrapredictor), MAX_SB_SIZE);
  } else {
    DECLARE_ALIGNED(16, uint8_t, intrapredictor[MAX_SB_SQUARE]);
    av1_build_intra_predictors_for_interintra(cm, xd, bsize, plane, ctx,
                                              intrapredictor, MAX_SB_SIZE);
    av1_combine_interintra(xd, bsize, plane, pred, stride, intrapredictor,
                           MAX_SB_SIZE);
  }
}